

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O3

int launch(nvamemtiming_conf *conf,FILE *outf,uint8_t progression,color color)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint8_t *puVar4;
  uint uVar5;
  __time_t _Var6;
  __time_t _Var7;
  int iVar8;
  __pid_t _Var9;
  int extraout_EAX;
  uint uVar10;
  Display *dpy;
  FILE *pFVar11;
  undefined7 in_register_00000011;
  undefined1 *ref_val;
  char *pcVar12;
  Display *pDVar13;
  uint32_t reg;
  uint32_t regs_len;
  ulong uVar14;
  nvamemtiming_conf *pnVar15;
  color color_00;
  bool bVar16;
  int cur_perflvl;
  timeval tv;
  char acStackY_100 [32];
  code *pcStackY_e0;
  uint local_c0;
  uint local_bc;
  nvamemtiming_conf *local_b8;
  color local_ac;
  uint local_a8;
  int local_a4;
  FILE *local_a0;
  timeval local_98 [6];
  
  pcStackY_e0 = (code *)0x1043ea;
  printf("--- Start sequence number %u\n",CONCAT71(in_register_00000011,progression) & 0xffffffff);
  pcStackY_e0 = (code *)0x1043f6;
  iVar8 = system("rmmod nvidia");
  if (iVar8 == 0x7f) {
    pcStackY_e0 = (code *)0x104a26;
    launch_cold_15();
LAB_00104a26:
    pcStackY_e0 = (code *)0x104a2b;
    launch_cold_1();
LAB_00104a2b:
    pcStackY_e0 = (code *)0x104a30;
    launch_cold_7();
LAB_00104a30:
    pcStackY_e0 = (code *)0x104a35;
    launch_cold_6();
  }
  else {
    pcStackY_e0 = (code *)0x10440f;
    iVar8 = vbios_upload_pramin(conf->cnum,(conf->vbios).data,(int)(conf->vbios).length);
    if (iVar8 != 1) goto LAB_00104a26;
    pcStackY_e0 = (code *)0x104430;
    setenv("DISPLAY",":0",1);
    if (conf->mmiotrace != true) {
LAB_001044e9:
      pcStackY_e0 = (code *)0x1044ee;
      _Var9 = fork();
      if (_Var9 != -1) {
        if (_Var9 != 0) {
          local_a8 = (uint)(conf->timing).perflvl;
          local_bc = CONCAT31(local_bc._1_3_,conf->mmiotrace);
          uVar10 = 0;
          do {
            pcStackY_e0 = (code *)0x10451c;
            usleep(10000);
            pcStackY_e0 = (code *)0x104523;
            dpy = (Display *)XOpenDisplay(0);
            if (dpy != (Display *)0x0) break;
            bVar16 = uVar10 < 199;
            uVar10 = uVar10 + 1;
          } while (bVar16);
          pcStackY_e0 = (code *)0x104558;
          fwrite("-- Display opened\n",0x12,1,_stderr);
          if (dpy == (Display *)0x0) {
            pcStackY_e0 = (code *)0x104562;
            launch_cold_14();
            return extraout_EAX;
          }
          local_c0 = 0xffffffff;
          pcStackY_e0 = (code *)0x104590;
          local_ac = color;
          local_a0 = (FILE *)outf;
          gettimeofday(local_98,(__timezone_ptr_t)0x0);
          _Var6 = local_98[0].tv_sec;
          pcStackY_e0 = (code *)0x1045ab;
          pDVar13 = dpy;
          XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x109,(int *)&local_c0);
          pcStackY_e0 = (code *)0x1045b0;
          _Var9 = fork();
          if (_Var9 == -1) {
            pcStackY_e0 = shallow_dump;
            launch_cold_8();
            pcStackY_e0 = (code *)_Var6;
            bVar1 = *(byte *)((long)&pDVar13->free_funcs + 4);
            bVar2 = *(byte *)((long)&pDVar13->free_funcs + 5);
            uVar14 = (ulong)bVar2;
            if ((bVar1 == 0xff) || (uVar14 = 0xff, bVar2 == 0xff)) {
              sprintf(acStackY_100,"regs_timing_%i_%i",(ulong)bVar1,uVar14);
            }
            else {
              builtin_strncpy(acStackY_100,"regs_timing",0xc);
            }
            pFVar11 = fopen(acStackY_100,"wb");
            if (pFVar11 != (FILE *)0x0) {
              shallow_dump_cold_1();
            }
            else {
              perror("Open regs_timing");
            }
            return (uint)(pFVar11 == (FILE *)0x0);
          }
          local_b8 = conf;
          if (_Var9 != 0) {
            pcStackY_e0 = (code *)0x1045d3;
            sleep(1);
            do {
              pcStackY_e0 = (code *)0x1045eb;
              usleep(10000);
              pcStackY_e0 = (code *)0x1045f5;
              gettimeofday(local_98,(__timezone_ptr_t)0x0);
              _Var7 = local_98[0].tv_sec;
              pcStackY_e0 = (code *)0x104611;
              XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x107,&local_a4);
              if (local_a4 == 1) break;
            } while (_Var6 + 2U < (ulong)_Var7);
            pcStackY_e0 = (code *)0x10462a;
            kill(_Var9,0xf);
            pcStackY_e0 = (code *)0x104636;
            waitpid(_Var9,(int *)0x0,0);
            uVar14 = CONCAT71((uint7)(uint3)((uint)_Var9 >> 8),1);
            if ((char)local_bc != '\0') {
              pcStackY_e0 = (code *)0x104653;
              iVar8 = write_to_file("/sys/kernel/debug/tracing/trace_marker","Start downclocking\n")
              ;
              if (iVar8 != 0) {
                pcStackY_e0 = (code *)0x10465c;
                launch_cold_9();
                uVar14 = 0;
              }
            }
            pcStackY_e0 = (code *)0x10466e;
            gettimeofday(local_98,(__timezone_ptr_t)0x0);
            _Var6 = local_98[0].tv_sec;
            pcStackY_e0 = (code *)0x104691;
            fwrite("XNVCTRLQueryTargetAttribute\n",0x1c,1,_stderr);
            pcStackY_e0 = (code *)0x1046b0;
            XNVCTRLQueryTargetAttribute(dpy,1,0,0,0x10a,(int *)&local_c0);
            if (local_c0 == 1) {
              local_bc = (uint)uVar14;
              uVar10 = 0xffffffff;
              do {
                pcStackY_e0 = (code *)0x1046dd;
                gettimeofday(local_98,(__timezone_ptr_t)0x0);
                if (_Var6 + 0x3cU < (ulong)local_98[0].tv_sec) {
                  pcStackY_e0 = (code *)0x104749;
                  launch_cold_12();
                  uVar14 = (ulong)local_bc;
                  goto LAB_00104757;
                }
                pcStackY_e0 = (code *)0x1046fb;
                XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x109,(int *)&local_c0);
                uVar5 = local_c0;
                pcVar12 = "NV_CTRL_GPU_CURRENT_PERFORMANCE_LEVEL = %d\n";
                if (((int)uVar10 < 0) ||
                   (pcVar12 = "Changed NV_CTRL_GPU_CURRENT_PERFORMANCE_LEVEL = %d\n",
                   local_c0 != uVar10)) {
                  pcStackY_e0 = (code *)0x10472f;
                  fprintf(_stderr,pcVar12,(ulong)local_c0);
                  uVar10 = uVar5;
                }
              } while (uVar10 != local_a8);
              pcStackY_e0 = (code *)0x1047a7;
              launch_cold_11();
              pnVar15 = local_b8;
            }
            else {
              pcStackY_e0 = (code *)0x104739;
              launch_cold_10();
LAB_00104757:
              pnVar15 = local_b8;
              pcStackY_e0 = (code *)0x104761;
              sleep(1);
              pcStackY_e0 = (code *)0x104769;
              XCloseDisplay(dpy);
              pFVar11 = _stderr;
              pcStackY_e0 = (code *)0x104778;
              uVar10 = getpid();
              pcStackY_e0 = (code *)0x10478b;
              iVar8 = fprintf(pFVar11,"-- Display closed (pid = %i)\n",(ulong)uVar10);
              if ((char)uVar14 == '\0') {
                return iVar8;
              }
            }
            if (pnVar15->mmiotrace == true) {
              pcStackY_e0 = (code *)0x1047ca;
              iVar8 = write_to_file("/sys/kernel/debug/tracing/current_tracer","nop");
              if (iVar8 != 0) {
                pcStackY_e0 = (code *)0x104a1c;
                launch_cold_13();
              }
              pcStackY_e0 = (code *)0x1047de;
              puts("mmiotrace stopped");
            }
            pFVar11 = local_a0;
            uVar3 = (pnVar15->vbios).timing_entry_offset;
            puVar4 = (pnVar15->vbios).data;
            pcStackY_e0 = (code *)0x104809;
            fprintf(local_a0,"timing entry [%u/%u]: ",(ulong)(uint)(int)(char)progression,
                    (ulong)(pnVar15->vbios).timing_entry_length);
            if ((pnVar15->vbios).timing_entry_length != 0) {
              uVar14 = 0;
              do {
                pcVar12 = "%02x ";
                if ((int)(char)progression - 1 == uVar14) {
                  pcVar12 = "\x1b[0;31m%02x\x1b[0m ";
                }
                pcStackY_e0 = (code *)0x10483e;
                fprintf(pFVar11,pcVar12,(ulong)puVar4[uVar14 + uVar3]);
                uVar14 = uVar14 + 1;
              } while (uVar14 < (pnVar15->vbios).timing_entry_length);
            }
            pcStackY_e0 = (code *)0x104858;
            fputc(10,pFVar11);
            iVar8 = pnVar15->cnum;
            bVar16 = '\0' < (char)progression && local_ac != NO_COLOR;
            if ((nva_cards[iVar8]->chipset).card_type < 0xc0) {
              color_00 = (color)bVar16;
              pcStackY_e0 = (code *)0x10494c;
              dump_regs(iVar8,(FILE *)pFVar11,(uint32_t *)dump_timings_ref_val1,
                        (uint)dump_timings_ref_exist,0x100220,0x30,color_00);
              pcStackY_e0 = (code *)0x104974;
              dump_regs(pnVar15->cnum,(FILE *)pFVar11,(uint32_t *)dump_timings_ref_val2,
                        (uint)dump_timings_ref_exist,0x1002c0,0x30,color_00);
              pcStackY_e0 = (code *)0x10499c;
              dump_regs(pnVar15->cnum,(FILE *)pFVar11,(uint32_t *)dump_timings_ref_val3,
                        (uint)dump_timings_ref_exist,0x100510,0x10,color_00);
              iVar8 = pnVar15->cnum;
              ref_val = dump_timings_ref_val4;
              reg = 0x100710;
              regs_len = 0x10;
            }
            else {
              pcStackY_e0 = (code *)0x1048b5;
              dump_regs(iVar8,(FILE *)pFVar11,(uint32_t *)dump_timings_ref_val3,
                        (uint)dump_timings_ref_exist,0x10f240,0x20,(uint)bVar16);
              pcStackY_e0 = (code *)0x1048dd;
              dump_regs(pnVar15->cnum,(FILE *)pFVar11,(uint32_t *)dump_timings_ref_val1,
                        (uint)dump_timings_ref_exist,0x10f290,0xa0,(uint)bVar16);
              pcStackY_e0 = (code *)0x104905;
              dump_regs(pnVar15->cnum,(FILE *)pFVar11,(uint32_t *)dump_timings_ref_val4,
                        (uint)dump_timings_ref_exist,0x10f610,0x10,(uint)bVar16);
              iVar8 = pnVar15->cnum;
              ref_val = dump_timings_ref_val2;
              reg = 0x10f720;
              regs_len = 0x20;
            }
            pcStackY_e0 = (code *)0x1049c4;
            dump_regs(iVar8,(FILE *)pFVar11,(uint32_t *)ref_val,(uint)dump_timings_ref_exist,reg,
                      regs_len,(uint)bVar16);
            pcStackY_e0 = (code *)0x1049d1;
            fputc(10,pFVar11);
            pcStackY_e0 = (code *)0x1049d9;
            fflush(pFVar11);
            dump_timings_ref_exist = 1;
            pcStackY_e0 = (code *)0x1049ec;
            system("killall X");
            do {
              pcStackY_e0 = (code *)0x1049f3;
              _Var9 = wait((void *)0x0);
            } while (0 < _Var9);
            pnVar15->counter = pnVar15->counter + 1;
            pcStackY_e0 = (code *)0x104a05;
            uVar10 = sleep(5);
            return uVar10;
          }
          pcVar12 = "timeout 3 glxgears";
          goto LAB_00104a5e;
        }
        goto LAB_00104a2b;
      }
      goto LAB_00104a30;
    }
    pcStackY_e0 = (code *)0x104456;
    iVar8 = mount("debugfs","/sys/kernel/debug","debugfs",0,(void *)0x0);
    if (iVar8 != 0) {
      pcStackY_e0 = (code *)0x104465;
      launch_cold_2();
    }
    pcStackY_e0 = (code *)0x104478;
    iVar8 = write_to_file("/sys/kernel/debug/tracing/buffer_size_kb","128000");
    if (iVar8 != 0) {
      pcStackY_e0 = (code *)0x104484;
      launch_cold_3();
    }
    pcStackY_e0 = (code *)0x104497;
    iVar8 = write_to_file("/sys/kernel/debug/tracing/current_tracer","mmiotrace");
    if (iVar8 != 0) {
      pcStackY_e0 = (code *)0x1044a3;
      launch_cold_4();
    }
    pcStackY_e0 = (code *)0x1044b6;
    iVar8 = write_to_file("/sys/kernel/debug/tracing/current_tracer","mmiotrace");
    if (iVar8 != 0) {
      pcStackY_e0 = (code *)0x1044c2;
      launch_cold_5();
    }
    pcStackY_e0 = (code *)0x1044c7;
    _Var9 = fork();
    if (_Var9 != 0) {
      if (_Var9 < 0) {
        pcStackY_e0 = (code *)0x1044dd;
        perror("fork");
      }
      pcStackY_e0 = (code *)0x1044e9;
      puts("mmiotrace started");
      goto LAB_001044e9;
    }
  }
  pcVar12 = (char *)local_98;
  pcStackY_e0 = (code *)0x104a52;
  snprintf(pcVar12,100,"cat /sys/kernel/debug/tracing/trace_pipe > mmt_entry_%i",
           CONCAT71(in_register_00000011,progression) & 0xffffffff);
LAB_00104a5e:
  pcStackY_e0 = (code *)0x104a63;
  iVar8 = system(pcVar12);
  pcStackY_e0 = (code *)0x104a6a;
  exit(iVar8);
}

Assistant:

static int
launch(struct nvamemtiming_conf *conf, FILE *outf, uint8_t progression, enum color color)
{
	printf("--- Start sequence number %u\n", progression);

	if (system("rmmod nvidia") == 127)
	{
		fprintf(stderr, "rmmod not found. Abort\n");
		exit (2);
	}

	if (vbios_upload_pramin(conf->cnum, conf->vbios.data, conf->vbios.length) != 1)
	{
		fprintf(stderr, "upload failed. Abort\n");
		exit(3);
	}

	/* modify our env so as we can launch apps on X */
	setenv("DISPLAY", ":0", 1);

	/* monitor downclocking */
	if (conf->mmiotrace)
		mmiotrace_start(progression);

	pid_t pid = fork();
	if (pid == 0) {
		system("killall X 2> /dev/null > /dev/null");
		system("X > /dev/null 2> /dev/null");
		fprintf(stderr, "X exited, let's quit!\n");
		exit(0);
	} else if (pid == -1) {
		fprintf(stderr, "Fork failed! Abort\n");
		exit (4);
	}

	/* X runs, wait for the right perflvl to be selected */
	if (force_timing_changes(conf->timing.perflvl, conf->mmiotrace))
		return 1;

	if (conf->mmiotrace)
                mmiotrace_stop();

	dump_timings(conf, outf, progression, color);

	system("killall X");

	/* wait for all zombie processes */
	while(wait(NULL) > 0);

	/* increase the launch counter */
	conf->counter++;

	/* wait for the nvidia driver to modeset back to the crappy resolution */
	sleep(5);

	return 0;
}